

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O1

void __thiscall
mp::SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
HandleFeasibleSolution
          (SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this,
          int status,CStringRef message,double *values,double *dual_values,double param_5)

{
  int iVar1;
  char *__s;
  StrictMockProblemBuilder *pSVar2;
  long *plVar3;
  size_t sVar4;
  TestSolver *pTVar5;
  Buffer<char> *pBVar6;
  Result RVar7;
  size_t size;
  char *str;
  ulong uVar8;
  size_t new_size;
  SolutionAdapter<StrictMockProblemBuilder> sol;
  MemoryWriter filename;
  SolutionAdapter<StrictMockProblemBuilder> local_2f0;
  BasicWriter<char> local_258;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> local_248;
  
  this->num_solutions_ = this->num_solutions_ + 1;
  __s = (this->solver_->super_Solver).super_BasicSolver.solution_stub_._M_dataplus._M_p;
  if (*__s != '\0') {
    pSVar2 = this->builder_;
    plVar3 = (this->options_).data_;
    sVar4 = (this->options_).size_;
    if (values == (double *)0x0) {
      local_2f0.values_.size_ = 0;
    }
    else {
      RVar7 = MockProblemBuilder::num_vars
                        (&(pSVar2->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
      local_2f0.values_.size_ = (size_t)RVar7;
    }
    if (dual_values == (double *)0x0) {
      local_2f0.dual_values_.size_ = 0;
    }
    else {
      RVar7 = MockProblemBuilder::num_algebraic_cons
                        (&(this->builder_->super_StrictMock<MockProblemBuilder>).
                          super_MockProblemBuilder);
      local_2f0.dual_values_.size_ = (size_t)RVar7;
    }
    pTVar5 = this->solver_;
    if (((pTVar5->super_Solver).super_BasicSolver.opts_read_ != true) ||
       (local_2f0.objno_ = 0, (pTVar5->super_Solver).super_BasicSolver.obj_added_ == true)) {
      iVar1 = (pTVar5->super_Solver).super_BasicSolver.objno_;
      local_2f0.objno_ = -iVar1;
      if (0 < iVar1) {
        local_2f0.objno_ = iVar1;
      }
    }
    local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0028b328;
    local_248.super_Buffer<char>.size_ = 0;
    local_248.super_Buffer<char>.capacity_ = 500;
    local_248.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0028b370;
    local_2f0.status_ = status;
    local_2f0.builder_ = pSVar2;
    local_2f0.message_ = message.data_;
    local_2f0.options_.data_ = plVar3;
    local_2f0.options_.size_ = sVar4;
    local_2f0.values_.data_ = values;
    local_2f0.dual_values_.data_ = dual_values;
    local_258.buffer_ = &local_248.super_Buffer<char>;
    local_248.super_Buffer<char>.ptr_ = local_248.data_;
    size = strlen(__s);
    if (500 < size) {
      fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
    }
    if (size != 0) {
      memmove(local_248.super_Buffer<char>.ptr_ + local_248.super_Buffer<char>.size_,__s,size);
    }
    local_248.super_Buffer<char>.size_ = size;
    fmt::BasicWriter<char>::write_decimal<int>(&local_258,this->num_solutions_);
    pBVar6 = local_258.buffer_;
    uVar8 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_ + 4;
    if (((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->capacity_ < uVar8) {
      (**((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->_vptr_Buffer)
                (local_258.buffer_,uVar8);
    }
    builtin_strncpy(((Buffer<char> *)&pBVar6->_vptr_Buffer)->ptr_ +
                    ((Buffer<char> *)&pBVar6->_vptr_Buffer)->size_,".sol",4);
    ((Buffer<char> *)&pBVar6->_vptr_Buffer)->size_ = uVar8;
    sVar4 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
    if (((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->capacity_ < sVar4 + 1) {
      (**((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->_vptr_Buffer)();
    }
    ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->ptr_[sVar4] = '\0';
    WriteSolFile<mp::SolutionAdapter<StrictMockProblemBuilder>>
              ((CStringRef)((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->ptr_,&local_2f0);
    local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0028b328;
    local_248.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0028b370;
    if (local_248.super_Buffer<char>.ptr_ != local_248.data_) {
      operator_delete(local_248.super_Buffer<char>.ptr_,local_248.super_Buffer<char>.capacity_);
    }
    if (local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f0.dual_values_.save_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2f0.dual_values_.save_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f0.dual_values_.save_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f0.values_.save_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f0.values_.save_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SolutionWriterImpl<Solver, PB, Writer>::
HandleFeasibleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double) {
  ++num_solutions_;
  const char *solution_stub = solver_.solution_stub();
  if (!*solution_stub)
    return;
  SolutionAdapter<PB> sol(
        status, &builder_, message.c_str(), options_,
        MakeArrayRef(values, values ? builder_.num_vars() : 0),
        MakeArrayRef(dual_values,
                     dual_values ? builder_.num_algebraic_cons() : 0),
        solver_.objno_used());
  fmt::MemoryWriter filename;
  filename << solution_stub << num_solutions_ << ".sol";
  this->Write(filename.c_str(), sol);
}